

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkMutableDescriptorTypeCreateInfoEXT *create_info,ScratchAllocator *alloc)

{
  VkMutableDescriptorTypeCreateInfoEXT *pVVar1;
  VkMutableDescriptorTypeListEXT *pVVar2;
  VkDescriptorType *pVVar3;
  long lVar4;
  uint32_t i;
  ulong uVar5;
  
  pVVar1 = copy<VkMutableDescriptorTypeCreateInfoEXT>(this,create_info,1,alloc);
  if (pVVar1->pMutableDescriptorTypeLists != (VkMutableDescriptorTypeListEXT *)0x0) {
    pVVar2 = copy<VkMutableDescriptorTypeListEXT>
                       (this,create_info->pMutableDescriptorTypeLists,
                        (ulong)create_info->mutableDescriptorTypeListCount,alloc);
    pVVar1->pMutableDescriptorTypeLists = pVVar2;
  }
  lVar4 = 8;
  for (uVar5 = 0; uVar5 < pVVar1->mutableDescriptorTypeListCount; uVar5 = uVar5 + 1) {
    pVVar2 = pVVar1->pMutableDescriptorTypeLists;
    pVVar3 = *(VkDescriptorType **)((long)&pVVar2->descriptorTypeCount + lVar4);
    if (pVVar3 != (VkDescriptorType *)0x0) {
      pVVar3 = copy<VkDescriptorType>(this,pVVar3,(ulong)*(uint *)((long)pVVar2 + lVar4 + -8),alloc)
      ;
      *(VkDescriptorType **)((long)&pVVar2->descriptorTypeCount + lVar4) = pVVar3;
    }
    lVar4 = lVar4 + 0x10;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkMutableDescriptorTypeCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pMutableDescriptorTypeLists)
		info->pMutableDescriptorTypeLists = copy(create_info->pMutableDescriptorTypeLists, create_info->mutableDescriptorTypeListCount, alloc);

	for (uint32_t i = 0; i < info->mutableDescriptorTypeListCount; i++)
	{
		auto &l = const_cast<VkMutableDescriptorTypeListEXT &>(info->pMutableDescriptorTypeLists[i]);
		if (l.pDescriptorTypes)
			l.pDescriptorTypes = copy(l.pDescriptorTypes, l.descriptorTypeCount, alloc);
	}

	return info;
}